

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void hputi4(char *hstring,char *keyword,int ival)

{
  uint in_EDX;
  char value [30];
  char *in_stack_00000120;
  char *in_stack_00000128;
  char *in_stack_00000130;
  char acStack_38 [56];
  
  snprintf(acStack_38,0x1e,"%d",(ulong)in_EDX);
  hputc(in_stack_00000130,in_stack_00000128,in_stack_00000120);
  return;
}

Assistant:

static void
hputi4 (hstring,keyword,ival)

  char *hstring;	/* character string containing FITS-style header
			   information in the format
			   <keyword>= <value> {/ <comment>}
			   each entry is padded with spaces to 80 characters */

  char *keyword;		/* character string containing the name of the variable
			   to be returned.  hput searches for a line beginning
			   with this string, and if there isn't one, creates one.
		   	   The first 8 characters of keyword must be unique. */
  int ival;		/* int number */
{
    char value[30];

    /* Translate value from binary to ASCII */
    snprintf (value,30,"%d",ival);

    /* Put value into header string */
    hputc (hstring,keyword,value);

    /* Return to calling program */
    return;
}